

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_attribute_struct *a;
  bool bVar1;
  xml_node xVar2;
  xml_node_struct *n;
  xml_node_struct *n_00;
  xml_node local_40;
  xpath_node_set_raw *local_38;
  
  if (xn[1] == 0) {
    local_40._root = (xml_node_struct *)*xn;
  }
  else {
    xml_node::xml_node(&local_40);
  }
  if (local_40._root == (xml_node_struct *)0x0) {
    if ((xn[1] != 0) && (*xn != 0)) {
      a = (xml_attribute_struct *)xn[1];
      if (a == (xml_attribute_struct *)0x0) {
        if (*xn == 0) {
          xml_node::xml_node(&local_40);
          xVar2._root = local_40._root;
        }
        else {
          xml_node::xml_node(&local_40,*(xml_node_struct **)(*xn + 0x18));
          xVar2._root = local_40._root;
        }
      }
      else {
        xVar2._root = (xml_node_struct *)*xn;
      }
      if (this->_test == '\x02') {
        step_push(this,ns,a,xVar2._root,alloc);
      }
    }
  }
  else {
    if (xn[1] == 0) {
      local_40._root = (xml_node_struct *)*xn;
    }
    else {
      xml_node::xml_node(&local_40);
    }
    xVar2._root = local_40._root;
    local_38 = ns;
    bVar1 = step_push(this,ns,local_40._root,alloc);
    if (((bVar1 & once) == 0) && (n_00 = (xVar2._root)->first_child, n_00 != (xml_node_struct *)0x0)
       ) {
      bVar1 = step_push(this,local_38,n_00,alloc);
      while ((bVar1 & once) == 0) {
        n = n_00->first_child;
        if (n == (xml_node_struct *)0x0) {
          while (n = n_00->next_sibling, n == (xml_node_struct *)0x0) {
            n_00 = n_00->parent;
            if (n_00 == xVar2._root) {
              return;
            }
          }
        }
        bVar1 = step_push(this,local_38,n,alloc);
        n_00 = n;
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}